

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

void __thiscall
llvm::write_double(llvm *this,raw_ostream *S,double N,FloatStyle Style,
                  Optional<unsigned_long> Precision)

{
  char cVar1;
  char C;
  unsigned_long N_00;
  raw_ostream *prVar2;
  undefined4 in_register_00000014;
  uint uVar3;
  char *Str;
  SmallString<8U> Spec;
  format_object<double> local_a0;
  char Buf [32];
  raw_svector_ostream Out;
  Optional<unsigned_long> Precision_local;
  
  Precision_local.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer._4_4_ =
       in_register_00000014;
  Precision_local.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer._0_4_ = Style;
  uVar3 = (uint)S;
  Precision_local.Storage.hasVal =
       Precision.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer[0];
  Out.super_raw_pwrite_stream.super_raw_ostream._vptr_raw_ostream =
       (_func_int **)((ulong)(uVar3 < 2) * 4 + 2);
  N_00 = Optional<unsigned_long>::getValueOr<unsigned_long>(&Precision_local,(unsigned_long *)&Out);
  if (NAN(N)) {
    Str = "nan";
  }
  else {
    if (ABS(N) != INFINITY) {
      cVar1 = 'f';
      if (uVar3 == 1) {
        cVar1 = 'E';
      }
      C = 'e';
      if (uVar3 != 0) {
        C = cVar1;
      }
      Spec.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           &Spec.super_SmallVector<char,_8U>.super_SmallVectorStorage<char,_8U>;
      Spec.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = 0;
      Spec.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = 8;
      raw_svector_ostream::raw_svector_ostream(&Out,(SmallVectorImpl<char> *)&Spec);
      prVar2 = raw_ostream::operator<<((raw_ostream *)&Out,"%.");
      prVar2 = raw_ostream::operator<<(prVar2,N_00);
      raw_ostream::operator<<(prVar2,C);
      if (uVar3 == 3) {
        local_a0.super_format_object_base.Fmt = SmallString<8U>::c_str(&Spec);
        local_a0.super_format_object_base._vptr_format_object_base =
             (_func_int **)&PTR_home_001dc470;
        local_a0.Vals.super__Tuple_impl<0UL,_double>.super__Head_base<0UL,_double,_false>.
        _M_head_impl = (_Tuple_impl<0UL,_double>)(_Tuple_impl<0UL,_double>)(N * 100.0);
        format_object<double>::snprint_tuple<0ul>(&local_a0,Buf,0x20);
        raw_ostream::operator<<((raw_ostream *)this,Buf);
        raw_ostream::operator<<((raw_ostream *)this,'%');
      }
      else {
        local_a0.super_format_object_base.Fmt = SmallString<8U>::c_str(&Spec);
        local_a0.super_format_object_base._vptr_format_object_base =
             (_func_int **)&PTR_home_001dc470;
        local_a0.Vals.super__Tuple_impl<0UL,_double>.super__Head_base<0UL,_double,_false>.
        _M_head_impl = (_Tuple_impl<0UL,_double>)(_Tuple_impl<0UL,_double>)N;
        format_object<double>::snprint_tuple<0ul>(&local_a0,Buf,0x20);
        raw_ostream::operator<<((raw_ostream *)this,Buf);
      }
      raw_ostream::~raw_ostream((raw_ostream *)&Out);
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&Spec);
      return;
    }
    Str = "INF";
  }
  raw_ostream::operator<<((raw_ostream *)this,Str);
  return;
}

Assistant:

void llvm::write_double(raw_ostream &S, double N, FloatStyle Style,
                        Optional<size_t> Precision) {
  size_t Prec = Precision.getValueOr(getDefaultPrecision(Style));

  if (std::isnan(N)) {
    S << "nan";
    return;
  } else if (std::isinf(N)) {
    S << "INF";
    return;
  }

  char Letter;
  if (Style == FloatStyle::Exponent)
    Letter = 'e';
  else if (Style == FloatStyle::ExponentUpper)
    Letter = 'E';
  else
    Letter = 'f';

  SmallString<8> Spec;
  llvm::raw_svector_ostream Out(Spec);
  Out << "%." << Prec << Letter;

  if (Style == FloatStyle::Exponent || Style == FloatStyle::ExponentUpper) {
#ifdef _WIN32
// On MSVCRT and compatible, output of %e is incompatible to Posix
// by default. Number of exponent digits should be at least 2. "%+03d"
// FIXME: Implement our formatter to here or Support/Format.h!
#if defined(__MINGW32__)
    // FIXME: It should be generic to C++11.
    if (N == 0.0 && std::signbit(N)) {
      char NegativeZero[] = "-0.000000e+00";
      if (Style == FloatStyle::ExponentUpper)
        NegativeZero[strlen(NegativeZero) - 4] = 'E';
      S << NegativeZero;
      return;
    }
#else
    int fpcl = _fpclass(N);

    // negative zero
    if (fpcl == _FPCLASS_NZ) {
      char NegativeZero[] = "-0.000000e+00";
      if (Style == FloatStyle::ExponentUpper)
        NegativeZero[strlen(NegativeZero) - 4] = 'E';
      S << NegativeZero;
      return;
    }
#endif

    char buf[32];
    unsigned len;
    len = format(Spec.c_str(), N).snprint(buf, sizeof(buf));
    if (len <= sizeof(buf) - 2) {
      if (len >= 5 && (buf[len - 5] == 'e' || buf[len - 5] == 'E') &&
          buf[len - 3] == '0') {
        int cs = buf[len - 4];
        if (cs == '+' || cs == '-') {
          int c1 = buf[len - 2];
          int c0 = buf[len - 1];
          if (isdigit(static_cast<unsigned char>(c1)) &&
              isdigit(static_cast<unsigned char>(c0))) {
            // Trim leading '0': "...e+012" -> "...e+12\0"
            buf[len - 3] = c1;
            buf[len - 2] = c0;
            buf[--len] = 0;
          }
        }
      }
      S << buf;
      return;
    }
#endif
  }

  if (Style == FloatStyle::Percent)
    N *= 100.0;

  char Buf[32];
  format(Spec.c_str(), N).snprint(Buf, sizeof(Buf));
  S << Buf;
  if (Style == FloatStyle::Percent)
    S << '%';
}